

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_initgamedialog.h
# Opt level: O3

void __thiscall Ui_InitGameDialog::setupUi(Ui_InitGameDialog *this,QDialog *InitGameDialog)

{
  QGridLayout *this_00;
  QLabel *pQVar1;
  QLineEdit *pQVar2;
  QDialogButtonBox *pQVar3;
  QSpinBox *this_01;
  undefined4 *puVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  uint in_stack_ffffffffffffff7c;
  QArrayData *local_70;
  undefined8 local_68;
  long local_60;
  QDialogButtonBox *local_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QSlotObjectBase local_40;
  
  QObject::objectName();
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  if (local_60 == 0) {
    QVar13.m_data = (storage_type *)0xe;
    QVar13.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar13);
    QObject::setObjectName((QString *)InitGameDialog);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,8);
      }
    }
  }
  local_70 = (QArrayData *)&DAT_12c00000190;
  QWidget::resize((QSize *)InitGameDialog);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,(QWidget *)InitGameDialog);
  this->gridLayout = this_00;
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_00);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,InitGameDialog,0);
  this->player1Label = pQVar1;
  QVar6.m_data = (storage_type *)0xc;
  QVar6.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar1);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->player1Label,0,1,1,1,0);
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,(QWidget *)InitGameDialog);
  this->editPlayer1 = pQVar2;
  QVar7.m_data = (storage_type *)0xb;
  QVar7.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)pQVar2);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->editPlayer1,0,4,1,1,0);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,InitGameDialog,0);
  this->player2Label = pQVar1;
  QVar8.m_data = (storage_type *)0xc;
  QVar8.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar1);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->player2Label,1,1,1,1,0);
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,(QWidget *)InitGameDialog);
  this->editPlayer2 = pQVar2;
  QVar9.m_data = (storage_type *)0xb;
  QVar9.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar2);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->editPlayer2,1,4,1,1,0);
  pQVar3 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar3,(QWidget *)InitGameDialog);
  this->buttonBox = pQVar3;
  QVar10.m_data = (storage_type *)0x9;
  QVar10.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar3);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QDialogButtonBox::setOrientation((Orientation)this->buttonBox);
  QDialogButtonBox::setStandardButtons(this->buttonBox,0x400400);
  QGridLayout::addWidget(this->gridLayout,this->buttonBox,3,1,1,4,0);
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,InitGameDialog,0);
  this->label = pQVar1;
  QVar11.m_data = (storage_type *)0x5;
  QVar11.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar1);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->label,2,1,1,1,0);
  this_01 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(this_01,(QWidget *)InitGameDialog);
  this->spinBox = this_01;
  QVar12.m_data = (storage_type *)0x7;
  QVar12.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)this_01);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  QSpinBox::setValue((int)this->spinBox);
  QGridLayout::addWidget(this->gridLayout,this->spinBox,2,4,1,1,0);
  retranslateUi(this,InitGameDialog);
  local_58 = this->buttonBox;
  local_70 = (QArrayData *)QDialogButtonBox::accepted;
  local_68 = 0;
  local_40.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1b9;
  local_40._4_4_ = 0;
  local_40.m_impl = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1b9;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)local_58,(QObject *)&local_70,(void **)InitGameDialog,&local_40,
             (ConnectionType)puVar4,(int *)((ulong)in_stack_ffffffffffffff7c << 0x20),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar3 = this->buttonBox;
  local_70 = (QArrayData *)QDialogButtonBox::rejected;
  local_68 = 0;
  local_40.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1c1;
  local_40._4_4_ = 0;
  local_40.m_impl = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar4 + 4) = 0x1c1;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar3,(QObject *)&local_70,(void **)InitGameDialog,&local_40,
             (ConnectionType)puVar4,(int *)((ulong)in_stack_ffffffffffffff7c << 0x20),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QMetaObject::connectSlotsByName((QObject *)InitGameDialog);
  return;
}

Assistant:

void setupUi(QDialog *InitGameDialog)
    {
        if (InitGameDialog->objectName().isEmpty())
            InitGameDialog->setObjectName(QString::fromUtf8("InitGameDialog"));
        InitGameDialog->resize(400, 300);
        gridLayout = new QGridLayout(InitGameDialog);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        player1Label = new QLabel(InitGameDialog);
        player1Label->setObjectName(QString::fromUtf8("player1Label"));

        gridLayout->addWidget(player1Label, 0, 1, 1, 1);

        editPlayer1 = new QLineEdit(InitGameDialog);
        editPlayer1->setObjectName(QString::fromUtf8("editPlayer1"));

        gridLayout->addWidget(editPlayer1, 0, 4, 1, 1);

        player2Label = new QLabel(InitGameDialog);
        player2Label->setObjectName(QString::fromUtf8("player2Label"));

        gridLayout->addWidget(player2Label, 1, 1, 1, 1);

        editPlayer2 = new QLineEdit(InitGameDialog);
        editPlayer2->setObjectName(QString::fromUtf8("editPlayer2"));

        gridLayout->addWidget(editPlayer2, 1, 4, 1, 1);

        buttonBox = new QDialogButtonBox(InitGameDialog);
        buttonBox->setObjectName(QString::fromUtf8("buttonBox"));
        buttonBox->setOrientation(Qt::Horizontal);
        buttonBox->setStandardButtons(QDialogButtonBox::Cancel|QDialogButtonBox::Ok);

        gridLayout->addWidget(buttonBox, 3, 1, 1, 4);

        label = new QLabel(InitGameDialog);
        label->setObjectName(QString::fromUtf8("label"));

        gridLayout->addWidget(label, 2, 1, 1, 1);

        spinBox = new QSpinBox(InitGameDialog);
        spinBox->setObjectName(QString::fromUtf8("spinBox"));
        spinBox->setValue(3);

        gridLayout->addWidget(spinBox, 2, 4, 1, 1);


        retranslateUi(InitGameDialog);
        QObject::connect(buttonBox, &QDialogButtonBox::accepted, InitGameDialog, qOverload<>(&QDialog::accept));
        QObject::connect(buttonBox, &QDialogButtonBox::rejected, InitGameDialog, qOverload<>(&QDialog::reject));

        QMetaObject::connectSlotsByName(InitGameDialog);
    }